

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O2

void inlet_fwd(_inlet *x,t_symbol *s,int argc,t_atom *argv)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  t_pd *x_00;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  t_symbol *s_00;
  ulong uVar6;
  undefined8 uStack_40;
  t_atom tStack_38;
  undefined8 uStack_28;
  
  lVar4 = (long)argc;
  (&tStack_38)[-lVar4].a_type = A_SYMBOL;
  (&tStack_38)[-lVar4].a_w.w_symbol = s;
  uVar6 = 0;
  uVar5 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
    puVar1 = (undefined8 *)((long)&argv->a_type + uVar6);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&uStack_28 + uVar6 + lVar4 * -0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
  }
  x_00 = x->i_dest;
  (&uStack_40)[lVar4 * -2] = 0x1691b4;
  s_00 = gensym("fwd");
  (&uStack_40)[lVar4 * -2] = 0x1691c4;
  pd_typedmess(x_00,s_00,argc + 1,&tStack_38 + -lVar4);
  return;
}

Assistant:

static void inlet_fwd(t_inlet *x, t_symbol *s, int argc, t_atom *argv)
{
    t_atom *argvec = (t_atom *)alloca((argc+1) * sizeof(t_atom));
    int i;
    SETSYMBOL(argvec, s);
    for (i = 0; i < argc; i++)
        argvec[i+1] = argv[i];
    typedmess(x->i_dest, gensym("fwd"), argc+1, argvec);
}